

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall QRasterPaintEnginePrivate::updateClipping(QRasterPaintEnginePrivate *this)

{
  QPaintEngineState *pQVar1;
  QRasterPaintEngineState *s;
  
  pQVar1 = ((this->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.q_ptr)->state;
  s = (QRasterPaintEngineState *)(pQVar1 + -2);
  if (pQVar1 == (QPaintEngineState *)0x0) {
    s = (QRasterPaintEngineState *)0x0;
  }
  if (((s->super_QPainterState).field_0x1a0 & 4) == 0) {
    return;
  }
  qrasterpaintengine_state_setNoClip(s);
  QPaintEngineExPrivate::replayClipOperations(&this->super_QPaintEngineExPrivate);
  return;
}

Assistant:

void QRasterPaintEnginePrivate::updateClipping()
{
    Q_Q(QRasterPaintEngine);
    QRasterPaintEngineState *s = q->state();

    if (!s->clipEnabled)
        return;

    qrasterpaintengine_state_setNoClip(s);
    replayClipOperations();
}